

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-ring.c
# Opt level: O3

size_t lws_ring_consume(lws_ring *ring,uint32_t *tail,void *dest,size_t max_count)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  void *__dest;
  uint *puVar6;
  uint32_t fake_tail;
  int local_40;
  uint local_34;
  
  if (tail == (uint32_t *)0x0) {
    uVar4 = ring->oldest_tail;
    puVar6 = &local_34;
    local_34 = uVar4;
  }
  else {
    uVar4 = *tail;
    puVar6 = tail;
  }
  uVar2 = 0;
  uVar1 = ring->head - uVar4;
  if (uVar1 != 0) {
    if (ring->head < uVar4 || uVar1 == 0) {
      uVar1 = uVar1 + ring->buflen;
    }
    uVar2 = (ulong)uVar1;
  }
  uVar1 = ring->buflen;
  uVar3 = (int)uVar2 - (int)(uVar2 % (ulong)ring->element_len);
  uVar2 = max_count * ring->element_len;
  if (uVar2 < (ulong)(long)(int)uVar3) {
    uVar3 = (uint)uVar2;
  }
  if (dest == (void *)0x0) {
    uVar1 = (uVar3 + uVar4) % uVar1;
    *puVar6 = uVar1;
    if (tail == (uint32_t *)0x0) {
      lws_ring_update_oldest_tail(ring,uVar1);
    }
  }
  else {
    __dest = dest;
    if (uVar1 < uVar3 + uVar4) {
      iVar5 = uVar1 - uVar4;
      memcpy(dest,(void *)((ulong)uVar4 + (long)ring->buf),(long)iVar5);
      *puVar6 = 0;
      __dest = (void *)((long)dest + (long)iVar5);
      uVar3 = uVar3 - iVar5;
      uVar4 = 0;
    }
    memcpy(__dest,(void *)((ulong)uVar4 + (long)ring->buf),(long)(int)uVar3);
    uVar1 = (uVar3 + *puVar6) % ring->buflen;
    *puVar6 = uVar1;
    if (tail == (uint32_t *)0x0) {
      lws_ring_update_oldest_tail(ring,uVar1);
    }
    local_40 = (int)dest;
    uVar3 = ((int)__dest + uVar3) - local_40;
  }
  return (ulong)uVar3 / (ulong)ring->element_len;
}

Assistant:

size_t
lws_ring_consume(struct lws_ring *ring, uint32_t *tail, void *dest,
		 size_t max_count)
{
	uint8_t *odest = dest;
	void *orig_tail = tail;
	uint32_t fake_tail;
	int m, n;

	if (!tail) {
		fake_tail = ring->oldest_tail;
		tail = &fake_tail;
	}

	/* n is how many bytes the whole fifo has for us */
	n = (int)(lws_ring_get_count_waiting_elements(ring, tail) *
							ring->element_len);

	/* restrict n to how much we want to insert */
	if ((size_t)n > max_count * ring->element_len)
		n = (int)(max_count * ring->element_len);

	if (!dest) {
		*tail = ((*tail) + (unsigned int)n) % ring->buflen;
		if (!orig_tail) /* single tail */
			lws_ring_update_oldest_tail(ring, *tail);

		return (unsigned int)n / ring->element_len;
	}
	if (*tail + (unsigned int)n > ring->buflen) {

		/*
		 * He does wrap.  The first memcpy should take us up to
		 * the end of the buffer
		 */

		m = (int32_t)(ring->buflen - *tail);
		memcpy(dest, ((uint8_t *)ring->buf) + *tail, (size_t)m);
		/* we know it will wrap exactly back to zero */
		*tail = 0;

		/* adapt the second memcpy for what we already did */

		dest = ((uint8_t *)dest) + m;
		n -= m;
	}

	memcpy(dest, ((uint8_t *)ring->buf) + *tail, (size_t)n);

	*tail = ((*tail) + (unsigned int)n) % ring->buflen;
	if (!orig_tail) /* single tail */
		lws_ring_update_oldest_tail(ring, *tail);

	return (unsigned int)(((uint8_t *)dest + n) - odest) / (unsigned int)ring->element_len;
}